

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O2

wsum_t * __thiscall Clasp::UncoreMinimize::computeSum(UncoreMinimize *this,Solver *s)

{
  uint uVar1;
  SharedData *lit;
  
  std::__fill_n_a<long*,unsigned_int,long>
            (this->sum_,(((this->super_MinimizeConstraint).shared_)->adjust_).ebo_.size);
  lit = (this->super_MinimizeConstraint).shared_ + 1;
  while (uVar1 = *(uint *)&(lit->adjust_).ebo_.buf, 3 < uVar1) {
    if ((byte)(*(byte *)((long)(s->assign_).assign_.ebo_.buf + (ulong)(uVar1 & 0xfffffffc)) & 3) ==
        (byte)(2U - ((uVar1 & 2) == 0))) {
      SharedMinimizeData::add
                ((this->super_MinimizeConstraint).shared_,this->sum_,(WeightLiteral *)lit);
    }
    lit = (SharedData *)&(lit->adjust_).ebo_.size;
  }
  return this->sum_;
}

Assistant:

wsum_t* UncoreMinimize::computeSum(const Solver& s) const {
	std::fill_n(sum_, shared_->numRules(), wsum_t(0));
	for (const WeightLiteral* it = shared_->lits; !isSentinel(it->first); ++it) {
		if (s.isTrue(it->first)) { shared_->add(sum_, *it); }
	}
	return sum_;
}